

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O2

int __thiscall binlog::Range::read<int>(Range *this)

{
  int iVar1;
  
  throw_if_overflow(this,4);
  iVar1 = *(int *)this->_begin;
  this->_begin = (char *)((long)this->_begin + 4);
  return iVar1;
}

Assistant:

T read()
  {
    static_assert(std::is_trivially_copyable<T>::value, "T must be trivially copyable");

    throw_if_overflow(sizeof(T));

    T dst;
    memcpy(&dst, _begin, sizeof(T));
    _begin += sizeof(T);

    return dst;
  }